

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

bstring bjoin(bstrList *bl,bstring sep)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bstring __ptr;
  uchar *puVar4;
  ulong uVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  
  if (bl != (bstrList *)0x0) {
    uVar1 = bl->qty;
    uVar5 = (ulong)uVar1;
    if ((-1 < (int)uVar1) &&
       ((sep == (bstring)0x0 || ((-1 < sep->slen && (sep->data != (uchar *)0x0)))))) {
      iVar6 = 1;
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          iVar2 = bl->entry[uVar3]->slen;
          if (iVar2 < 0) {
            return (bstring)0x0;
          }
          iVar6 = iVar6 + iVar2;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      if (sep != (bstring)0x0) {
        iVar6 = iVar6 + (uVar1 - 1) * sep->slen;
      }
      __ptr = (bstring)malloc(0x10);
      if (__ptr != (bstring)0x0) {
        puVar4 = (uchar *)malloc((long)iVar6);
        __ptr->data = puVar4;
        if (puVar4 != (uchar *)0x0) {
          __ptr->mlen = iVar6;
          __ptr->slen = iVar6 + -1;
          iVar6 = 0;
          if (uVar5 == 0) {
            lVar7 = 0;
          }
          else {
            uVar3 = 0;
            do {
              if (uVar3 != 0 && sep != (bstring)0x0) {
                iVar2 = sep->slen;
                memcpy(puVar4 + iVar6,sep->data,(long)iVar2);
                iVar6 = iVar6 + iVar2;
              }
              __n = (size_t)bl->entry[uVar3]->slen;
              memcpy(puVar4 + iVar6,bl->entry[uVar3]->data,__n);
              lVar7 = __n + (long)iVar6;
              uVar3 = uVar3 + 1;
              iVar6 = (int)lVar7;
            } while (uVar5 != uVar3);
          }
          puVar4[lVar7] = '\0';
          return __ptr;
        }
        free(__ptr);
      }
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoin (const struct bstrList * bl, const bstring sep) {
bstring b;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (sep != NULL && (sep->slen < 0 || sep->data == NULL)) return NULL;

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		c += v;
		if (c < 0) return NULL;	/* Wrap around ?? */
	}

	if (sep != NULL) c += (bl->qty - 1) * sep->slen;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL; /* Out of memory */
	b->data = (unsigned char *) bstr__alloc (c);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	b->mlen = c;
	b->slen = c-1;

	for (i = 0, c = 0; i < bl->qty; i++) {
		if (i > 0 && sep != NULL) {
			bstr__memcpy (b->data + c, sep->data, sep->slen);
			c += sep->slen;
		}
		v = bl->entry[i]->slen;
		bstr__memcpy (b->data + c, bl->entry[i]->data, v);
		c += v;
	}
	b->data[c] = (unsigned char) '\0';
	return b;
}